

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::mapsEqual<CoreML::Specification::Int64ToStringMap>
               (Int64ToStringMap *a,Int64ToStringMap *b)

{
  value_type *key;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar2;
  const_iterator __begin0;
  iterator_base<const_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  local_38;
  
  if ((int)((a->map_).map_.elements_)->num_elements_ ==
      (int)((b->map_).map_.elements_)->num_elements_) {
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    begin((const_iterator *)&local_38,&(a->map_).map_);
    while (bVar2 = local_38.node_ == (Node *)0x0, !bVar2) {
      key = ((local_38.node_)->kv).v_;
      __rhs = google::protobuf::
              Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::at(&(b->map_).map_,&key->first);
      bVar1 = std::operator!=(&key->second,__rhs);
      if (bVar1) {
        return bVar2;
      }
      google::protobuf::
      Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      InnerMap::
      iterator_base<const_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
      ::operator++(&local_38);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool mapsEqual(const T& a, const T& b) {
            if (a.map_size() != b.map_size()) {
                return false;
            }
            for (const auto& p : a.map()) {
                if (p.second != b.map().at(p.first)) {
                    return false;
                }
            }
            return true;
        }